

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

char * spvtools::opt::anon_unknown_18::ParseNumberUntilSeparator(char *str,uint32_t *number)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  string number_in_str;
  long *local_50 [2];
  long local_40 [2];
  
  for (pcVar5 = str; (cVar1 = *pcVar5, cVar1 != '\0' && (cVar1 != ':')); pcVar5 = pcVar5 + 1) {
    iVar3 = isspace((int)cVar1);
    if (iVar3 != 0) break;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,str,pcVar5);
  bVar2 = utils::ParseNumber<unsigned_int>((char *)local_50[0],number);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pcVar4 = (char *)0x0;
  if (bVar2) {
    pcVar4 = pcVar5;
  }
  return pcVar4;
}

Assistant:

const char* ParseNumberUntilSeparator(const char* str, uint32_t* number) {
  const char* number_begin = str;
  while (!IsSeparator(*str)) str++;
  const char* number_end = str;
  std::string number_in_str(number_begin, number_end - number_begin);
  if (!utils::ParseNumber(number_in_str.c_str(), number)) {
    // The descriptor set is not a valid uint32 number.
    return nullptr;
  }
  return str;
}